

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

void __thiscall Matrix<Rational>::inverseExt(Matrix<Rational> *this,Matrix<Rational> *ext)

{
  ulong uVar1;
  Rational *pRVar2;
  pointer puVar3;
  uint uVar4;
  matrix_error *this_00;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Rational coeff;
  uint local_dc;
  Rational local_b8;
  Rational local_70;
  
  if (this->N == this->M) {
    if (this->M == ext->M) {
      uVar4 = gauss(this,ext);
      local_dc = this->N;
      uVar5 = (ulong)local_dc;
      if (uVar4 == local_dc) {
        if (uVar5 != 0) {
          do {
            local_dc = local_dc - 1;
            uVar1 = uVar5 - 1;
            BigInteger::BigInteger(&local_b8._numerator,1);
            BigInteger::BigInteger(&local_b8._denominator,1);
            iVar6 = (int)uVar1;
            ::operator/(&local_70,&local_b8,
                        this->arr + (ulong)(this->N * iVar6) + (uVar1 & 0xffffffff));
            if (local_b8._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b8._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar7 = (ulong)this->N;
            if (this->N != 0) {
              lVar9 = 0;
              uVar8 = 0;
              do {
                Rational::operator*=
                          ((Rational *)
                           ((long)&this->arr[(int)uVar7 * local_dc]._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar9),&local_70);
                uVar8 = uVar8 + 1;
                uVar7 = (ulong)this->N;
                lVar9 = lVar9 + 0x40;
              } while (uVar8 < uVar7);
            }
            uVar7 = (ulong)ext->N;
            if (ext->N != 0) {
              lVar9 = 0;
              uVar8 = 0;
              do {
                Rational::operator*=
                          ((Rational *)
                           ((long)&ext->arr[(int)uVar7 * local_dc]._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar9),&local_70);
                uVar8 = uVar8 + 1;
                uVar7 = (ulong)ext->N;
                lVar9 = lVar9 + 0x40;
              } while (uVar8 < uVar7);
            }
            uVar4 = this->N;
            for (; uVar5 < uVar4; uVar5 = uVar5 + 1) {
              if (this->arr[uVar4 * iVar6 + uVar5]._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  this->arr[uVar4 * iVar6 + uVar5]._numerator.digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                uVar7 = (ulong)ext->N;
                if (ext->N != 0) {
                  lVar9 = 0;
                  uVar8 = 0;
                  do {
                    ::operator*(&local_b8,
                                (Rational *)
                                ((long)&ext->arr[(uint)((int)uVar7 * (int)uVar5)]._numerator.digits.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar9),
                                this->arr + this->N * iVar6 + uVar5);
                    Rational::operator-=
                              ((Rational *)
                               ((long)&ext->arr[ext->N * local_dc]._numerator.digits.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar9),&local_b8)
                    ;
                    if (local_b8._denominator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_b8._denominator.digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_b8._numerator.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_b8._numerator.digits.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar8 = uVar8 + 1;
                    uVar7 = (ulong)ext->N;
                    lVar9 = lVar9 + 0x40;
                  } while (uVar8 < uVar7);
                }
                BigInteger::BigInteger(&local_b8._numerator,0);
                BigInteger::BigInteger(&local_b8._denominator,1);
                uVar4 = this->N * iVar6;
                pRVar2 = this->arr;
                puVar3 = pRVar2[uVar4 + uVar5]._numerator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pRVar2[uVar4 + uVar5]._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_b8._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pRVar2[uVar4 + uVar5]._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_b8._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                pRVar2[uVar4 + uVar5]._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_b8._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_b8._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_b8._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_b8._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (puVar3 != (pointer)0x0) {
                  operator_delete(puVar3);
                }
                pRVar2[uVar4 + uVar5]._numerator.negative = local_b8._numerator.negative;
                puVar3 = pRVar2[uVar4 + uVar5]._denominator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pRVar2[uVar4 + uVar5]._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_b8._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                pRVar2[uVar4 + uVar5]._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_b8._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                pRVar2[uVar4 + uVar5]._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_b8._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_b8._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_b8._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_b8._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (puVar3 != (pointer)0x0) {
                  operator_delete(puVar3);
                }
                pRVar2[uVar4 + uVar5]._denominator.negative = local_b8._denominator.negative;
                if (local_b8._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8._denominator.digits.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_b8._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8._numerator.digits.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              uVar4 = this->N;
            }
            if (local_70._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_70._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar5 = uVar1;
          } while (iVar6 != 0);
        }
        return;
      }
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Cannot inverse a singular matrix");
    }
    else {
      this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
      matrix_error::runtime_error(this_00,"Invalid use of inverseExt");
    }
  }
  else {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Trying to inverse a non-square matrix");
  }
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Matrix<Field>::inverseExt(Matrix &ext)
{
    if(N != M)
        throw matrix_error("Trying to inverse a non-square matrix");
    if(M != ext.M)
    {
        throw matrix_error("Invalid use of inverseExt");
    }
    if(gauss(&ext) != N)
    {
        throw matrix_error("Cannot inverse a singular matrix");
    }
    for(unsigned i = N - 1; i != unsigned(-1); --i)
    {
        Field coeff = Field(1) / (*this)[i][i];
        for(unsigned j = 0; j < N; ++j)
        {
            (*this)[i][j] *= coeff;
        }
        for(unsigned j = 0; j < ext.N; ++j)
        {
            ext[i][j] *= coeff;
        }
        for(unsigned j = i + 1; j < N; j++)
        {
            if(!(*this)[i][j])
                continue;
            for(unsigned q = 0; q < ext.N; q++)
            {
                ext[i][q] -= ext[j][q] * (*this)[i][j];
            }
            (*this)[i][j] = Field();
        }
    }
}